

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

shared_ptr<cppcms::http::file> __thiscall cppcms::widgets::file::value(file *this)

{
  _data *p_Var1;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long *in_RSI;
  shared_ptr<cppcms::http::file> sVar2;
  string local_40;
  
  if ((*(byte *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x1f0) & 2) != 0) {
    (this->super_base_html_input)._vptr_base_html_input = (_func_int **)in_RSI[0x11];
    p_Var1 = (_data *)in_RSI[0x12];
    (this->super_base_html_input).d.ptr_ = p_Var1;
    if (p_Var1 != (_data *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      }
    }
    sVar2.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         in_RDX._M_pi;
    sVar2.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<cppcms::http::file>)
           sVar2.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"File was not loaded","");
  booster::runtime_error::runtime_error(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00284840;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

booster::shared_ptr<http::file> file::value()
{
	if(!set())
		throw cppcms_error("File was not loaded");
	return file_;
}